

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_color.cpp
# Opt level: O3

void __thiscall ON_Color::ON_Color(ON_Color *this,int r,int g,int b)

{
  uchar uVar1;
  uchar uVar2;
  uchar uVar3;
  int iVar4;
  uchar uVar5;
  
  iVar4 = 0xff;
  if ((uint)r < 0xff) {
    iVar4 = r;
  }
  uVar5 = '\0';
  uVar3 = (uchar)iVar4;
  if (r < 0) {
    uVar3 = uVar5;
  }
  iVar4 = 0xff;
  if ((uint)g < 0xff) {
    iVar4 = g;
  }
  uVar2 = (uchar)iVar4;
  if (g < 0) {
    uVar2 = uVar5;
  }
  iVar4 = 0xff;
  if ((uint)b < 0xff) {
    iVar4 = b;
  }
  uVar1 = (uchar)iVar4;
  if (b < 0) {
    uVar1 = uVar5;
  }
  (this->field_0).m_RGBA[0] = uVar3;
  (this->field_0).m_RGBA[1] = uVar2;
  (this->field_0).m_RGBA[2] = uVar1;
  (this->field_0).m_RGBA[3] = '\0';
  return;
}

Assistant:

ON_Color::ON_Color(int r, int g, int b)
{
  SetRGB(r,g,b);
}